

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtmf.c
# Opt level: O2

void usage(char *selfname)

{
  fprintf(_stderr,
          "GHA dtmf example utility, usage: %s <FILE> <OFFSET> <LEN> [<EXPECTED_FREQ_LOW> <EXPECTED_MAGNITUDE_LOW>, <EXPECTED_FREQ_HIGH>, <EXPECTED_MAGNITUDE_HIGH>]\n"
          ,selfname);
  fwrite("FILE - input pcm file (raw pcm, mono, 8 bit, 8000 kHz\n",0x36,1,_stderr);
  fwrite("OFFSET - offset in input file, samples\n",0x27,1,_stderr);
  fwrite("LEN - len to process, samples\n",0x1e,1,_stderr);
  fwrite("Following options are optional used by test framework:\n",0x37,1,_stderr);
  fwrite("EXPECTED_FREQ_(LOW|HIGH) - expected angular frequency\n",0x36,1,_stderr);
  fwrite("EXPECTED_MAGNITUDE_(LOW|HIGH) - expected magnitude (0 - 1)\n",0x3b,1,_stderr);
  return;
}

Assistant:

void usage(const char* selfname) {
	fprintf(stderr, "GHA dtmf example utility, usage: %s <FILE> <OFFSET> <LEN> [<EXPECTED_FREQ_LOW> <EXPECTED_MAGNITUDE_LOW>, <EXPECTED_FREQ_HIGH>, <EXPECTED_MAGNITUDE_HIGH>]\n", selfname);
	fprintf(stderr, "FILE - input pcm file (raw pcm, mono, 8 bit, 8000 kHz\n");
	fprintf(stderr, "OFFSET - offset in input file, samples\n");
	fprintf(stderr, "LEN - len to process, samples\n");
	fprintf(stderr, "Following options are optional used by test framework:\n");
	fprintf(stderr, "EXPECTED_FREQ_(LOW|HIGH) - expected angular frequency\n");
	fprintf(stderr, "EXPECTED_MAGNITUDE_(LOW|HIGH) - expected magnitude (0 - 1)\n");
}